

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

BIGNUM * BN_new(void)

{
  BIGNUM *pBVar1;
  
  pBVar1 = (BIGNUM *)CRYPTO_zalloc(0x18);
  if (pBVar1 == (BIGNUM *)0x0) {
    pBVar1 = (BIGNUM *)0x0;
  }
  else {
    pBVar1->flags = 1;
  }
  return pBVar1;
}

Assistant:

BIGNUM *BN_new(void)
{
    BIGNUM *ret;

    if ((ret = CRYPTO_zalloc(sizeof(*ret))) == NULL) {
        //BNerr(BN_F_BN_NEW, ERR_R_MALLOC_FAILURE);
        return (NULL);
    }
    ret->flags = BN_FLG_MALLOCED;
    bn_check_top(ret);
    return (ret);
}